

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

int __thiscall
CAPSFile::AddGapRecord(CAPSFile *this,StreamRecording *record,int nb_byte_to_add,uchar byte)

{
  uint uVar1;
  uchar *__src;
  uchar *puVar2;
  uint local_34;
  uint c;
  uchar *tmp_1;
  int tmp;
  uint size;
  uchar byte_local;
  int nb_byte_to_add_local;
  StreamRecording *record_local;
  CAPSFile *this_local;
  
  tmp_1._4_4_ = 0;
  for (tmp_1._0_4_ = nb_byte_to_add << 3; 0 < (int)tmp_1; tmp_1._0_4_ = (int)tmp_1 >> 8) {
    tmp_1._4_4_ = tmp_1._4_4_ + 1;
  }
  if (record->size - record->offset <= tmp_1._4_4_ + 5) {
    __src = record->buffer;
    puVar2 = (uchar *)operator_new__((ulong)(record->size << 1));
    record->buffer = puVar2;
    memcpy(record->buffer,__src,(ulong)record->size);
    record->size = record->size << 1;
    if (__src != (uchar *)0x0) {
      operator_delete__(__src);
    }
  }
  if (tmp_1._4_4_ != 0) {
    uVar1 = record->offset;
    record->offset = uVar1 + 1;
    record->buffer[uVar1] = (byte)(tmp_1._4_4_ << 5) | 1;
    for (local_34 = 0; local_34 < tmp_1._4_4_; local_34 = local_34 + 1) {
      uVar1 = record->offset;
      record->offset = uVar1 + 1;
      record->buffer[uVar1] =
           (uchar)((nb_byte_to_add << 3) >>
                  (((char)tmp_1._4_4_ - ((char)local_34 + '\x01')) * '\b' & 0x1fU));
    }
    uVar1 = record->offset;
    record->offset = uVar1 + 1;
    record->buffer[uVar1] = '\"';
    uVar1 = record->offset;
    record->offset = uVar1 + 1;
    record->buffer[uVar1] = '\b';
    uVar1 = record->offset;
    record->offset = uVar1 + 1;
    record->buffer[uVar1] = byte;
    uVar1 = record->offset;
    record->offset = uVar1 + 1;
    record->buffer[uVar1] = '\0';
  }
  return 0;
}

Assistant:

int CAPSFile::AddGapRecord(StreamRecording* record, int nb_byte_to_add, unsigned char byte)
{
   unsigned int size = 0;
   nb_byte_to_add *= 8;
   int tmp = nb_byte_to_add;
   while (tmp > 0)
   {
      tmp >>= 8;
      size++;
   }

   if (record->size - record->offset <= (size + 5))
   {
      unsigned char* tmp = record->buffer;

      record->buffer = new unsigned char[record->size * 2];
      memcpy(record->buffer, tmp, record->size);
      record->size = record->size * 2;
      delete[]tmp;
   }
   if (size > 0)
   {
      record->buffer[record->offset++] = (size << 5) | 0x01;
      for (unsigned int c = 0; c < size; c++)
      {
         record->buffer[record->offset++] = ((nb_byte_to_add >> (8 * (size - (c + 1)))) & 0xFF);
      }

      // Sample now
      record->buffer[record->offset++] = (1 << 5) | 0x02;
      record->buffer[record->offset++] = 8;
      record->buffer[record->offset++] = byte; // Sample
      record->buffer[record->offset++] = 0x00; // End of data
   }
   return 0;
}